

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O0

char * faidx_fetch_seq(faidx_t *fai,char *c_name,int p_beg_i,int p_end_i,int *len)

{
  undefined4 uVar1;
  undefined4 uVar3;
  long lVar2;
  khint_t kVar4;
  int iVar5;
  faidx1_t *pfVar6;
  ushort **ppuVar7;
  int ret;
  char *seq;
  faidx1_t val;
  khiter_t iter;
  int c;
  int l;
  int *len_local;
  int p_end_i_local;
  int p_beg_i_local;
  char *c_name_local;
  faidx_t *fai_local;
  
  kVar4 = kh_get_s(fai->hash,c_name);
  if (kVar4 == fai->hash->n_buckets) {
    *len = -2;
    fprintf(_stderr,"[fai_fetch_seq] The sequence \"%s\" not found\n",c_name);
    fai_local = (faidx_t *)0x0;
  }
  else {
    pfVar6 = fai->hash->vals + kVar4;
    uVar1 = pfVar6->line_len;
    uVar3 = pfVar6->line_blen;
    lVar2 = pfVar6->len;
    len_local._4_4_ = p_beg_i;
    if (p_end_i < p_beg_i) {
      len_local._4_4_ = p_end_i;
    }
    if (len_local._4_4_ < 0) {
      len_local._4_4_ = 0;
    }
    else if (lVar2 <= len_local._4_4_) {
      len_local._4_4_ = (int)lVar2 + -1;
    }
    if (p_end_i < 0) {
      len_local._0_4_ = 0;
    }
    else {
      len_local._0_4_ = p_end_i;
      if (lVar2 <= p_end_i) {
        len_local._0_4_ = (int)lVar2 + -1;
      }
    }
    iVar5 = bgzf_useek(fai->bgzf,
                       pfVar6->offset + (long)((len_local._4_4_ / (int)uVar3) * uVar1) +
                       (long)(len_local._4_4_ % (int)uVar3),0);
    if (iVar5 < 0) {
      *len = -1;
      fprintf(_stderr,
              "[fai_fetch_seq] Error: fai_fetch failed. (Seeking in a compressed, .gzi unindexed, file?)\n"
             );
      fai_local = (faidx_t *)0x0;
    }
    else {
      iter = 0;
      fai_local = (faidx_t *)malloc((long)(((int)len_local - len_local._4_4_) + 2));
      while (iVar5 = bgzf_getc(fai->bgzf),
            -1 < iVar5 && (int)iter < ((int)len_local - len_local._4_4_) + 1) {
        ppuVar7 = __ctype_b_loc();
        if (((*ppuVar7)[iVar5] & 0x8000) != 0) {
          *(char *)((long)&fai_local->bgzf + (long)(int)iter) = (char)iVar5;
          iter = iter + 1;
        }
      }
      *(undefined1 *)((long)&fai_local->bgzf + (long)(int)iter) = 0;
      *len = iter;
    }
  }
  return (char *)fai_local;
}

Assistant:

char *faidx_fetch_seq(const faidx_t *fai, const char *c_name, int p_beg_i, int p_end_i, int *len)
{
    int l, c;
    khiter_t iter;
    faidx1_t val;
    char *seq=NULL;

    // Adjust position
    iter = kh_get(s, fai->hash, c_name);
    if (iter == kh_end(fai->hash))
    {
        *len = -2;
        fprintf(stderr, "[fai_fetch_seq] The sequence \"%s\" not found\n", c_name);
        return NULL;
    }
    val = kh_value(fai->hash, iter);
    if(p_end_i < p_beg_i) p_beg_i = p_end_i;
    if(p_beg_i < 0) p_beg_i = 0;
    else if(val.len <= p_beg_i) p_beg_i = val.len - 1;
    if(p_end_i < 0) p_end_i = 0;
    else if(val.len <= p_end_i) p_end_i = val.len - 1;

    // Now retrieve the sequence
    int ret = bgzf_useek(fai->bgzf, val.offset + p_beg_i / val.line_blen * val.line_len + p_beg_i % val.line_blen, SEEK_SET);
    if ( ret<0 )
    {
        *len = -1;
        fprintf(stderr, "[fai_fetch_seq] Error: fai_fetch failed. (Seeking in a compressed, .gzi unindexed, file?)\n");
        return NULL;
    }
    l = 0;
    seq = (char*)malloc(p_end_i - p_beg_i + 2);
    while ( (c=bgzf_getc(fai->bgzf))>=0 && l < p_end_i - p_beg_i + 1)
        if (isgraph(c)) seq[l++] = c;
    seq[l] = '\0';
    *len = l;
    return seq;
}